

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int createCollation(sqlite3 *db,char *zName,u8 enc,void *pCtx,
                   _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  code *pcVar1;
  uint uVar2;
  uint uVar3;
  byte enc_00;
  int iVar4;
  CollSeq *pCVar5;
  void *pvVar6;
  undefined7 in_register_00000011;
  long lVar7;
  
  uVar2 = (uint)CONCAT71(in_register_00000011,enc);
  uVar3 = 2;
  if ((uVar2 - 4 & 0xfb) != 0) {
    uVar3 = uVar2;
  }
  enc_00 = (byte)uVar3;
  if (0xfffffffc < uVar3 - 4) {
    pCVar5 = sqlite3FindCollSeq(db,enc_00,zName,0);
    if ((pCVar5 != (CollSeq *)0x0) &&
       (pCVar5->xCmp != (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0)) {
      if (db->nVdbeActive != 0) {
        sqlite3ErrorWithMsg(db,5,
                            "unable to delete/modify collation sequence due to active statements");
        return 5;
      }
      sqlite3ExpirePreparedStatements(db,0);
      if (uVar3 == (pCVar5->enc & 0xfffffff7)) {
        pvVar6 = sqlite3HashFind(&db->aCollSeq,zName);
        for (lVar7 = 0; lVar7 != 0x78; lVar7 = lVar7 + 0x28) {
          if (*(u8 *)((long)pvVar6 + lVar7 + 8) == pCVar5->enc) {
            pcVar1 = *(code **)((long)pvVar6 + lVar7 + 0x20);
            if (pcVar1 != (code *)0x0) {
              (*pcVar1)(*(undefined8 *)((long)pvVar6 + lVar7 + 0x10));
            }
            *(undefined8 *)((long)pvVar6 + lVar7 + 0x18) = 0;
          }
        }
      }
    }
    pCVar5 = sqlite3FindCollSeq(db,enc_00,zName,1);
    if (pCVar5 == (CollSeq *)0x0) {
      iVar4 = 7;
    }
    else {
      pCVar5->xCmp = xCompare;
      pCVar5->pUser = pCtx;
      pCVar5->xDel = xDel;
      pCVar5->enc = enc_00 | enc & 8;
      iVar4 = 0;
      sqlite3Error(db,0);
    }
    return iVar4;
  }
  iVar4 = sqlite3MisuseError(0x2ac1c);
  return iVar4;
}

Assistant:

static int createCollation(
  sqlite3* db,
  const char *zName,
  u8 enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  CollSeq *pColl;
  int enc2;

  assert( sqlite3_mutex_held(db->mutex) );

  /* If SQLITE_UTF16 is specified as the encoding type, transform this
  ** to one of SQLITE_UTF16LE or SQLITE_UTF16BE using the
  ** SQLITE_UTF16NATIVE macro. SQLITE_UTF16 is not used internally.
  */
  enc2 = enc;
  testcase( enc2==SQLITE_UTF16 );
  testcase( enc2==SQLITE_UTF16_ALIGNED );
  if( enc2==SQLITE_UTF16 || enc2==SQLITE_UTF16_ALIGNED ){
    enc2 = SQLITE_UTF16NATIVE;
  }
  if( enc2<SQLITE_UTF8 || enc2>SQLITE_UTF16BE ){
    return SQLITE_MISUSE_BKPT;
  }

  /* Check if this call is removing or replacing an existing collation
  ** sequence. If so, and there are active VMs, return busy. If there
  ** are no active VMs, invalidate any pre-compiled statements.
  */
  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 0);
  if( pColl && pColl->xCmp ){
    if( db->nVdbeActive ){
      sqlite3ErrorWithMsg(db, SQLITE_BUSY,
        "unable to delete/modify collation sequence due to active statements");
      return SQLITE_BUSY;
    }
    sqlite3ExpirePreparedStatements(db, 0);

    /* If collation sequence pColl was created directly by a call to
    ** sqlite3_create_collation, and not generated by synthCollSeq(),
    ** then any copies made by synthCollSeq() need to be invalidated.
    ** Also, collation destructor - CollSeq.xDel() - function may need
    ** to be called.
    */
    if( (pColl->enc & ~SQLITE_UTF16_ALIGNED)==enc2 ){
      CollSeq *aColl = sqlite3HashFind(&db->aCollSeq, zName);
      int j;
      for(j=0; j<3; j++){
        CollSeq *p = &aColl[j];
        if( p->enc==pColl->enc ){
          if( p->xDel ){
            p->xDel(p->pUser);
          }
          p->xCmp = 0;
        }
      }
    }
  }

  pColl = sqlite3FindCollSeq(db, (u8)enc2, zName, 1);
  if( pColl==0 ) return SQLITE_NOMEM_BKPT;
  pColl->xCmp = xCompare;
  pColl->pUser = pCtx;
  pColl->xDel = xDel;
  pColl->enc = (u8)(enc2 | (enc & SQLITE_UTF16_ALIGNED));
  sqlite3Error(db, SQLITE_OK);
  return SQLITE_OK;
}